

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

bilingual_str * common::TransactionErrorString(TransactionError err)

{
  undefined4 in_ESI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffea0;
  string *original;
  allocator<char> *in_stack_fffffffffffffea8;
  allocator<char> *paVar1;
  char *in_stack_fffffffffffffeb0;
  bilingual_str *pbVar2;
  allocator<char> local_110;
  allocator<char> local_10f;
  allocator<char> local_10e;
  allocator<char> local_10d;
  allocator<char> local_10c;
  undefined1 local_10b [2];
  allocator<char> local_109 [257];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
    paVar1 = local_109;
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,(char *)paVar1,in_stack_fffffffffffffea8);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(local_109);
    break;
  case 1:
    paVar1 = (allocator<char> *)(local_10b + 1);
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,paVar1);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator((allocator<char> *)(local_10b + 1));
    break;
  case 2:
    original = (string *)local_10b;
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Untranslated(original);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator((allocator<char> *)local_10b);
    break;
  case 3:
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_10c);
    break;
  case 4:
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_10d);
    break;
  case 5:
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_10e);
    break;
  case 6:
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_10f);
    break;
  case 7:
    pbVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&pbVar2->original,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Untranslated(in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(in_stack_fffffffffffffe68);
    std::allocator<char>::~allocator(&local_110);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                  ,0x91,"bilingual_str common::TransactionErrorString(const TransactionError)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

bilingual_str TransactionErrorString(const TransactionError err)
{
    switch (err) {
        case TransactionError::OK:
            return Untranslated("No error");
        case TransactionError::MISSING_INPUTS:
            return Untranslated("Inputs missing or spent");
        case TransactionError::ALREADY_IN_UTXO_SET:
            return Untranslated("Transaction outputs already in utxo set");
        case TransactionError::MEMPOOL_REJECTED:
            return Untranslated("Transaction rejected by mempool");
        case TransactionError::MEMPOOL_ERROR:
            return Untranslated("Mempool internal error");
        case TransactionError::MAX_FEE_EXCEEDED:
            return Untranslated("Fee exceeds maximum configured by user (e.g. -maxtxfee, maxfeerate)");
        case TransactionError::MAX_BURN_EXCEEDED:
            return Untranslated("Unspendable output exceeds maximum configured by user (maxburnamount)");
        case TransactionError::INVALID_PACKAGE:
            return Untranslated("Transaction rejected due to invalid package");
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}